

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O2

int pfx_table_src_remove(pfx_table *pfx_table,rtr_socket *socket)

{
  pthread_rwlock_t *__rwlock;
  long lVar1;
  int iVar2;
  uint i;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &pfx_table->lock;
  uVar3 = 0;
  do {
    if (uVar3 == 2) {
LAB_00103324:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return -(uint)(uVar3 < 2);
      }
      __stack_chk_fail();
    }
    pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    if ((&pfx_table->ipv4)[uVar3 != 0] != (trie_node *)0x0) {
      iVar2 = pfx_table_remove_id(pfx_table,&pfx_table->ipv4 + (uVar3 != 0),
                                  (&pfx_table->ipv4)[uVar3 != 0],socket,0);
      if (iVar2 == -1) {
        pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        goto LAB_00103324;
      }
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

RTRLIB_EXPORT int pfx_table_src_remove(struct pfx_table *pfx_table, const struct rtr_socket *socket)
{
	for (unsigned int i = 0; i < 2; i++) {
		struct trie_node **root = (i == 0 ? &(pfx_table->ipv4) : &(pfx_table->ipv6));

		pthread_rwlock_wrlock(&(pfx_table->lock));
		if (*root) {
			int rtval = pfx_table_remove_id(pfx_table, root, *root, socket, 0);

			if (rtval == PFX_ERROR) {
				pthread_rwlock_unlock(&pfx_table->lock);
				return PFX_ERROR;
			}
		}
		pthread_rwlock_unlock(&pfx_table->lock);
	}
	return PFX_SUCCESS;
}